

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcLampType::~IfcLampType(IfcLampType *this)

{
  ~IfcLampType((IfcLampType *)
               &this[-1].super_IfcFlowTerminalType.super_IfcDistributionFlowElementType.
                super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.
                super_IfcTypeObject.field_0x48);
  return;
}

Assistant:

IfcLampType() : Object("IfcLampType") {}